

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O3

int ColorWasHinted(pyhanabi_card_knowledge_t *knowledge)

{
  if (knowledge == (pyhanabi_card_knowledge_t *)0x0) {
    __assert_fail("knowledge != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x37,"int ColorWasHinted(pyhanabi_card_knowledge_t *)");
  }
  if ((uint *)knowledge->knowledge != (uint *)0x0) {
    return ~*knowledge->knowledge >> 0x1f;
  }
  __assert_fail("knowledge->knowledge != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x38,"int ColorWasHinted(pyhanabi_card_knowledge_t *)");
}

Assistant:

int ColorWasHinted(pyhanabi_card_knowledge_t* knowledge) {
  REQUIRE(knowledge != nullptr);
  REQUIRE(knowledge->knowledge != nullptr);
  return reinterpret_cast<
             const hanabi_learning_env::HanabiHand::CardKnowledge*>(
             knowledge->knowledge)
      ->ColorHinted();
}